

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O3

int N_VDotProdMultiLocal(int nvec,N_Vector x,N_Vector *Y,realtype *dotprods)

{
  _func_int_int_N_Vector_N_Vector_ptr_realtype_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ulong uVar2;
  realtype rVar3;
  
  UNRECOVERED_JUMPTABLE = x->ops->nvdotprodmultilocal;
  if (UNRECOVERED_JUMPTABLE == (_func_int_int_N_Vector_N_Vector_ptr_realtype_ptr *)0x0) {
    if (x->ops->nvdotprodlocal == (_func_realtype_N_Vector_N_Vector *)0x0) {
      iVar1 = -1;
    }
    else if (nvec < 1) {
      iVar1 = 0;
    }
    else {
      iVar1 = 0;
      uVar2 = 0;
      do {
        rVar3 = (*x->ops->nvdotprodlocal)(x,Y[uVar2]);
        dotprods[uVar2] = rVar3;
        uVar2 = uVar2 + 1;
      } while ((uint)nvec != uVar2);
    }
    return iVar1;
  }
  iVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,x,Y,dotprods);
  return iVar1;
}

Assistant:

int N_VDotProdMultiLocal(int nvec, N_Vector x, N_Vector* Y, realtype* dotprods)
{
  int i;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(x));

  if (x->ops->nvdotprodmultilocal)
    return((int) x->ops->nvdotprodmultilocal(nvec, x, Y, dotprods));

  if (x->ops->nvdotprodlocal) {
    for (i = 0; i < nvec; i++) {
      dotprods[i] = x->ops->nvdotprodlocal(x, Y[i]);
    }
    return(0);
  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(x));
  return(-1);
}